

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

GreaterEqualLayerParams * __thiscall
CoreML::Specification::GreaterEqualLayerParams::New(GreaterEqualLayerParams *this,Arena *arena)

{
  GreaterEqualLayerParams *this_00;
  
  this_00 = (GreaterEqualLayerParams *)operator_new(0x18);
  GreaterEqualLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GreaterEqualLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GreaterEqualLayerParams* GreaterEqualLayerParams::New(::google::protobuf::Arena* arena) const {
  GreaterEqualLayerParams* n = new GreaterEqualLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}